

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O3

void intgemm::TestMultiplyBiasRelu<intgemm::SSE2::Kernels16>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  float *pfVar1;
  float *pfVar2;
  UnquantizeAndAddBiasAndWriteRelu callback;
  anon_class_16_2_a84000ed callback_00;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  float *int_ref;
  size_t __i;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [16];
  int iVar11;
  ulong uVar12;
  Index r;
  ulong uVar13;
  long lVar14;
  float fVar15;
  undefined4 uVar16;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 uVar33;
  undefined1 auVar36 [16];
  __m128i tmp_1;
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 uVar43;
  __m128i tmp;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined4 uVar51;
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  AlignedVector<float> B;
  AlignedVector<float> test_C;
  AlignedVector<float> A;
  float unquant_mult;
  AlignedVector<float> bias;
  AlignedVector<short> A_prep;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<short> B_quant;
  AlignedVector<short> B_prep;
  ostringstream info;
  mt19937 gen;
  AlignedVector<float> *pAVar58;
  AlignedVector<float> local_1630;
  AlignedVector<float> local_1620;
  AlignedVector<float> local_1610;
  float local_15fc;
  float local_15f8;
  float local_15f4;
  float local_15f0;
  undefined4 local_15ec;
  AlignedVector<float> local_15e8;
  ulong local_15d8;
  AlignedVector<short> local_15d0;
  AlignedVector<float> local_15c0;
  AlignedVector<float> local_15b0;
  AlignedVector<short> local_15a0;
  AlignedVector<short> local_1590;
  ulong local_1580;
  undefined4 local_1578;
  undefined4 uStack_1574;
  float *pfStack_1570;
  AlignedVector<float> *local_1568;
  undefined4 *local_1560;
  AlignedVector<float> *pAStack_1558;
  string local_1550;
  ostringstream local_1530 [112];
  ios_base local_14c0 [264];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  undefined1 auVar17 [12];
  undefined1 auVar20 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar34 [12];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [12];
  undefined1 auVar45 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  
  local_15fc = int_tolerance;
  local_15f8 = float_tolerance;
  local_15f4 = MSE_float_tolerance;
  local_15f0 = MSE_int_tolerance;
  std::__cxx11::ostringstream::ostringstream(local_1530);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"16-bit SSE2",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"\t",1);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1530);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_13b8,1);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_13b8,1);
  local_15d8 = (ulong)B_cols;
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_13b8._M_x[0] = CONCAT71(local_13b8._M_x[0]._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_13b8,1);
  local_1580 = (ulong)(width * A_rows);
  AlignedVector<float>::AlignedVector(&local_1610,local_1580,0x40);
  AlignedVector<float>::AlignedVector(&local_1630,(ulong)(B_cols * width),0x40);
  AlignedVector<float>::AlignedVector(&local_15e8,local_15d8,0x40);
  pfVar1 = local_1610.mem_;
  local_13b8._M_x[0] = 0x1571;
  lVar8 = 1;
  uVar9 = 0x1571;
  do {
    uVar9 = (ulong)(((uint)(uVar9 >> 0x1e) ^ (uint)uVar9) * 0x6c078965 + (int)lVar8);
    local_13b8._M_x[lVar8] = uVar9;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_13b8._M_p = 0x270;
  if (local_1610.size_ != 0) {
    lVar14 = local_1610.size_ << 2;
    lVar8 = 0;
    do {
      fVar15 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar1 + lVar8) = fVar15 + fVar15 + -1.0;
      lVar8 = lVar8 + 4;
    } while (lVar14 != lVar8);
  }
  pfVar1 = local_1630.mem_;
  lVar8 = CONCAT44(local_1630.size_._4_4_,(uint)local_1630.size_);
  if (lVar8 != 0) {
    lVar14 = 0;
    do {
      fVar15 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar1 + lVar14) = fVar15 + fVar15 + -1.0;
      lVar14 = lVar14 + 4;
    } while (lVar8 << 2 != lVar14);
  }
  pfVar1 = local_15e8.mem_;
  if (local_15e8.size_ != 0) {
    lVar8 = 0;
    do {
      fVar15 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar1 + lVar8) = fVar15 + fVar15 + -1.0;
      lVar8 = lVar8 + 4;
    } while (local_15e8.size_ << 2 != lVar8);
  }
  local_15ec = 0x35800000;
  AlignedVector<short>::AlignedVector(&local_15d0,local_1610.size_,0x40);
  AlignedVector<short>::AlignedVector
            (&local_1590,CONCAT44(local_1630.size_._4_4_,(uint)local_1630.size_),0x40);
  if (local_1580 != 0) {
    lVar8 = 0;
    do {
      pfVar1 = (float *)((long)local_1610.mem_ + lVar8 * 2);
      auVar18._0_4_ = (int)(*pfVar1 * 1024.0);
      auVar18._4_4_ = (int)(pfVar1[1] * 1024.0);
      auVar18._8_4_ = (int)(pfVar1[2] * 1024.0);
      auVar18._12_4_ = (int)(pfVar1[3] * 1024.0);
      auVar24._0_4_ = (int)(pfVar1[4] * 1024.0);
      auVar24._4_4_ = (int)(pfVar1[5] * 1024.0);
      auVar24._8_4_ = (int)(pfVar1[6] * 1024.0);
      auVar24._12_4_ = (int)(pfVar1[7] * 1024.0);
      auVar18 = packssdw(auVar18,auVar24);
      *(undefined1 (*) [16])((long)local_15d0.mem_ + lVar8) = auVar18;
      lVar8 = lVar8 + 0x10;
    } while (pfVar1 + 8 != local_1610.mem_ + local_1580);
  }
  if (B_cols != 0) {
    uVar9 = 0;
    pauVar10 = (undefined1 (*) [16])local_1590.mem_;
    do {
      if (width != 0) {
        uVar12 = 0;
        uVar13 = 0;
        do {
          iVar11 = (int)uVar12;
          lVar8 = 0;
          do {
            pfVar1 = local_1630.mem_ + uVar9 + uVar12;
            pfVar2 = local_1630.mem_ + uVar9 + uVar12 + 4;
            auVar19._0_4_ = (int)(*pfVar1 * 1024.0);
            auVar19._4_4_ = (int)(pfVar1[1] * 1024.0);
            auVar19._8_4_ = (int)(pfVar1[2] * 1024.0);
            auVar19._12_4_ = (int)(pfVar1[3] * 1024.0);
            auVar25._0_4_ = (int)(*pfVar2 * 1024.0);
            auVar25._4_4_ = (int)(pfVar2[1] * 1024.0);
            auVar25._8_4_ = (int)(pfVar2[2] * 1024.0);
            auVar25._12_4_ = (int)(pfVar2[3] * 1024.0);
            auVar18 = packssdw(auVar19,auVar25);
            *(undefined1 (*) [16])(*pauVar10 + lVar8) = auVar18;
            lVar8 = lVar8 + 0x10;
            uVar12 = (ulong)((int)uVar12 + B_cols);
          } while (lVar8 != 0x80);
          auVar18 = *pauVar10;
          auVar24 = pauVar10[2];
          auVar29._0_12_ = auVar18._0_12_;
          auVar29._12_2_ = auVar18._6_2_;
          auVar29._14_2_ = *(undefined2 *)(pauVar10[1] + 6);
          auVar28._12_4_ = auVar29._12_4_;
          auVar28._0_10_ = auVar18._0_10_;
          auVar28._10_2_ = *(undefined2 *)(pauVar10[1] + 4);
          auVar27._10_6_ = auVar28._10_6_;
          auVar27._0_8_ = auVar18._0_8_;
          auVar27._8_2_ = auVar18._4_2_;
          auVar3._4_8_ = auVar27._8_8_;
          auVar3._2_2_ = *(undefined2 *)(pauVar10[1] + 2);
          auVar3._0_2_ = auVar18._2_2_;
          auVar26._0_4_ = CONCAT22(*(undefined2 *)pauVar10[1],auVar18._0_2_);
          auVar26._4_12_ = auVar3;
          uVar16 = CONCAT22(*(undefined2 *)(pauVar10[1] + 8),auVar18._8_2_);
          auVar17._0_8_ =
               CONCAT26(*(undefined2 *)(pauVar10[1] + 10),CONCAT24(auVar18._10_2_,uVar16));
          auVar17._8_2_ = auVar18._12_2_;
          auVar17._10_2_ = *(undefined2 *)(pauVar10[1] + 0xc);
          auVar20._12_2_ = auVar18._14_2_;
          auVar20._0_12_ = auVar17;
          auVar20._14_2_ = *(undefined2 *)(pauVar10[1] + 0xe);
          auVar49._0_12_ = auVar24._0_12_;
          auVar49._12_2_ = auVar24._6_2_;
          auVar49._14_2_ = *(undefined2 *)(pauVar10[3] + 6);
          auVar48._12_4_ = auVar49._12_4_;
          auVar48._0_10_ = auVar24._0_10_;
          auVar48._10_2_ = *(undefined2 *)(pauVar10[3] + 4);
          auVar47._10_6_ = auVar48._10_6_;
          auVar47._0_8_ = auVar24._0_8_;
          auVar47._8_2_ = auVar24._4_2_;
          auVar4._4_8_ = auVar47._8_8_;
          auVar4._2_2_ = *(undefined2 *)(pauVar10[3] + 2);
          auVar4._0_2_ = auVar24._2_2_;
          uVar43 = CONCAT22(*(undefined2 *)(pauVar10[3] + 8),auVar24._8_2_);
          auVar44._0_8_ =
               CONCAT26(*(undefined2 *)(pauVar10[3] + 10),CONCAT24(auVar24._10_2_,uVar43));
          auVar44._8_2_ = auVar24._12_2_;
          auVar44._10_2_ = *(undefined2 *)(pauVar10[3] + 0xc);
          auVar45._12_2_ = auVar24._14_2_;
          auVar45._0_12_ = auVar44;
          auVar45._14_2_ = *(undefined2 *)(pauVar10[3] + 0xe);
          auVar18 = pauVar10[4];
          auVar40._0_12_ = auVar18._0_12_;
          auVar40._12_2_ = auVar18._6_2_;
          auVar40._14_2_ = *(undefined2 *)(pauVar10[5] + 6);
          auVar39._12_4_ = auVar40._12_4_;
          auVar39._0_10_ = auVar18._0_10_;
          auVar39._10_2_ = *(undefined2 *)(pauVar10[5] + 4);
          auVar38._10_6_ = auVar39._10_6_;
          auVar38._0_8_ = auVar18._0_8_;
          auVar38._8_2_ = auVar18._4_2_;
          auVar5._4_8_ = auVar38._8_8_;
          auVar5._2_2_ = *(undefined2 *)(pauVar10[5] + 2);
          auVar5._0_2_ = auVar18._2_2_;
          auVar37._0_4_ = CONCAT22(*(undefined2 *)pauVar10[5],auVar18._0_2_);
          auVar37._4_12_ = auVar5;
          uVar33 = CONCAT22(*(undefined2 *)(pauVar10[5] + 8),auVar18._8_2_);
          auVar34._0_8_ =
               CONCAT26(*(undefined2 *)(pauVar10[5] + 10),CONCAT24(auVar18._10_2_,uVar33));
          auVar34._8_2_ = auVar18._12_2_;
          auVar34._10_2_ = *(undefined2 *)(pauVar10[5] + 0xc);
          auVar35._12_2_ = auVar18._14_2_;
          auVar35._0_12_ = auVar34;
          auVar35._14_2_ = *(undefined2 *)(pauVar10[5] + 0xe);
          auVar18 = pauVar10[6];
          auVar56._0_12_ = auVar18._0_12_;
          auVar56._12_2_ = auVar18._6_2_;
          auVar56._14_2_ = *(undefined2 *)(pauVar10[7] + 6);
          auVar55._12_4_ = auVar56._12_4_;
          auVar55._0_10_ = auVar18._0_10_;
          auVar55._10_2_ = *(undefined2 *)(pauVar10[7] + 4);
          auVar54._10_6_ = auVar55._10_6_;
          auVar54._0_8_ = auVar18._0_8_;
          auVar54._8_2_ = auVar18._4_2_;
          auVar6._4_8_ = auVar54._8_8_;
          auVar6._2_2_ = *(undefined2 *)(pauVar10[7] + 2);
          auVar6._0_2_ = auVar18._2_2_;
          uVar51 = CONCAT22(*(undefined2 *)(pauVar10[7] + 8),auVar18._8_2_);
          auVar52._0_8_ =
               CONCAT26(*(undefined2 *)(pauVar10[7] + 10),CONCAT24(auVar18._10_2_,uVar51));
          auVar52._8_2_ = auVar18._12_2_;
          auVar52._10_2_ = *(undefined2 *)(pauVar10[7] + 0xc);
          auVar53._12_2_ = auVar18._14_2_;
          auVar53._0_12_ = auVar52;
          auVar53._14_2_ = *(undefined2 *)(pauVar10[7] + 0xe);
          auVar42._0_8_ = auVar26._0_8_;
          auVar42._8_4_ = auVar3._0_4_;
          auVar42._12_4_ = auVar4._0_4_;
          auVar30._0_8_ = CONCAT44(auVar47._8_4_,auVar27._8_4_);
          auVar30._8_4_ = auVar28._12_4_;
          auVar30._12_4_ = auVar48._12_4_;
          auVar50._8_4_ = (int)((ulong)auVar17._0_8_ >> 0x20);
          auVar50._0_8_ = auVar17._0_8_;
          auVar50._12_4_ = (int)((ulong)auVar44._0_8_ >> 0x20);
          auVar21._0_8_ = CONCAT44(auVar44._8_4_,auVar17._8_4_);
          auVar21._8_4_ = auVar20._12_4_;
          auVar21._12_4_ = auVar45._12_4_;
          auVar46._0_8_ = auVar37._0_8_;
          auVar46._8_4_ = auVar5._0_4_;
          auVar46._12_4_ = auVar6._0_4_;
          auVar41._0_8_ = CONCAT44(auVar54._8_4_,auVar38._8_4_);
          auVar41._8_4_ = auVar39._12_4_;
          auVar41._12_4_ = auVar55._12_4_;
          auVar57._8_4_ = (int)((ulong)auVar34._0_8_ >> 0x20);
          auVar57._0_8_ = auVar34._0_8_;
          auVar57._12_4_ = (int)((ulong)auVar52._0_8_ >> 0x20);
          auVar36._0_8_ = CONCAT44(auVar52._8_4_,auVar34._8_4_);
          auVar36._8_4_ = auVar35._12_4_;
          auVar36._12_4_ = auVar53._12_4_;
          *(ulong *)*pauVar10 =
               CONCAT44(CONCAT22(*(undefined2 *)pauVar10[3],auVar24._0_2_),auVar26._0_4_);
          *(ulong *)(*pauVar10 + 8) =
               CONCAT44(CONCAT22(*(undefined2 *)pauVar10[7],auVar18._0_2_),auVar37._0_4_);
          *(long *)pauVar10[5] = auVar50._8_8_;
          *(long *)(pauVar10[5] + 8) = auVar57._8_8_;
          auVar31._8_8_ = auVar41._8_8_;
          auVar31._0_8_ = auVar30._8_8_;
          *(undefined8 *)pauVar10[2] = auVar30._0_8_;
          *(undefined8 *)(pauVar10[2] + 8) = auVar41._0_8_;
          auVar22._8_8_ = auVar36._8_8_;
          auVar22._0_8_ = auVar21._8_8_;
          pauVar10[7] = auVar22;
          *(long *)pauVar10[1] = auVar42._8_8_;
          *(long *)(pauVar10[1] + 8) = auVar46._8_8_;
          *(ulong *)pauVar10[4] = CONCAT44(uVar43,uVar16);
          *(ulong *)(pauVar10[4] + 8) = CONCAT44(uVar51,uVar33);
          pauVar10[3] = auVar31;
          *(undefined8 *)pauVar10[6] = auVar21._0_8_;
          *(undefined8 *)(pauVar10[6] + 8) = auVar36._0_8_;
          uVar13 = uVar13 + 8;
          pauVar10 = pauVar10 + 8;
          uVar12 = (ulong)(iVar11 + B_cols * 8);
        } while (uVar13 < width);
      }
      uVar9 = uVar9 + 8;
    } while (uVar9 < local_15d8);
  }
  AlignedVector<float>::AlignedVector(&local_1620,(ulong)(B_cols * A_rows),0x40);
  local_1578 = 0x35800000;
  pfStack_1570 = local_15e8.mem_;
  local_1568 = (AlignedVector<float> *)local_1620.mem_;
  callback._4_4_ = uStack_1574;
  callback.unquant_mult = 9.536743e-07;
  callback.bias_addr = local_15e8.mem_;
  callback.output_addr = local_1620.mem_;
  pAVar58 = (AlignedVector<float> *)local_1620.mem_;
  SSE2::Kernels16::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>
            (local_15d0.mem_,local_1590.mem_,A_rows,width,B_cols,callback);
  AlignedVector<short>::AlignedVector
            (&local_15a0,CONCAT44(local_1630.size_._4_4_,(uint)local_1630.size_),0x40);
  if ((ulong)(uint)local_1630.size_ != 0) {
    lVar8 = 0;
    do {
      pfVar1 = (float *)((long)local_1630.mem_ + lVar8 * 2);
      auVar23._0_4_ = (int)(*pfVar1 * 1024.0);
      auVar23._4_4_ = (int)(pfVar1[1] * 1024.0);
      auVar23._8_4_ = (int)(pfVar1[2] * 1024.0);
      auVar23._12_4_ = (int)(pfVar1[3] * 1024.0);
      auVar32._0_4_ = (int)(pfVar1[4] * 1024.0);
      auVar32._4_4_ = (int)(pfVar1[5] * 1024.0);
      auVar32._8_4_ = (int)(pfVar1[6] * 1024.0);
      auVar32._12_4_ = (int)(pfVar1[7] * 1024.0);
      auVar18 = packssdw(auVar23,auVar32);
      *(undefined1 (*) [16])((long)local_15a0.mem_ + lVar8) = auVar18;
      lVar8 = lVar8 + 0x10;
    } while (pfVar1 + 8 != local_1630.mem_ + (uint)local_1630.size_);
  }
  AlignedVector<float>::AlignedVector(&local_15b0,local_1620.size_,0x40);
  local_1560 = &local_15ec;
  callback_00.bias = pAVar58;
  callback_00.unquant_mult = (float *)&local_15e8;
  pAStack_1558 = &local_15e8;
  references::
  Multiply<short,_short,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:460:99),_nullptr>
            ((references *)local_15d0.mem_,local_15a0.mem_,(short *)local_15b0.mem_,
             (float *)(ulong)A_rows,width,B_cols,(Index)local_1560,callback_00);
  AlignedVector<float>::AlignedVector(&local_15c0,local_1620.size_,0x40);
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:465:86),_nullptr>
            (local_1610.mem_,local_1630.mem_,local_15c0.mem_,A_rows,width,B_cols,&local_15e8);
  int_ref = local_15b0.mem_;
  pfVar2 = local_15c0.mem_;
  pfVar1 = local_1620.mem_;
  std::__cxx11::stringbuf::str();
  CompareMSE(pfVar2,int_ref,pfVar1,local_1620.size_,&local_1550,local_15fc,local_15f8,local_15f4,
             local_15f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1550._M_dataplus._M_p != &local_1550.field_2) {
    operator_delete(local_1550._M_dataplus._M_p);
  }
  free(local_15c0.mem_);
  free(local_15b0.mem_);
  free(local_15a0.mem_);
  free(local_1620.mem_);
  free(local_1590.mem_);
  free(local_15d0.mem_);
  free(local_15e8.mem_);
  free(local_1630.mem_);
  free(local_1610.mem_);
  std::__cxx11::ostringstream::~ostringstream(local_1530);
  std::ios_base::~ios_base(local_14c0);
  return;
}

Assistant:

void TestMultiplyBiasRelu(Index A_rows, Index width, Index B_cols,
 float int_tolerance = 0.1f, float float_tolerance = 1.0f, float MSE_float_tolerance = 0.0f, float MSE_int_tolerance = 0.0f) {
  using Integer = typename Routine::Integer;
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float quant_mult = (sizeof(Integer) == 2) ? 1024 : 64;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<Integer> A_prep(A.size());
  AlignedVector<Integer> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  Routine::Multiply(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWriteRelu(unquant_mult, bias.begin(), test_C.begin()));

  AlignedVector<Integer> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Assuming A is just quantization here.
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return std::max(0.0f, sum * unquant_mult + bias[info.col_idx]);
  });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return std::max(0.0f, static_cast<float>(sum) + bias[info.col_idx]);
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}